

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bundle_adjustment.cc
# Opt level: O2

void __thiscall
sfm::ba::BundleAdjustment::update_camera
          (BundleAdjustment *this,Camera *cam,double *update,Camera *out)

{
  double *pdVar1;
  long lVar2;
  double *pdVar3;
  BundleAdjustment *this_00;
  double dVar4;
  undefined1 local_b8 [8];
  double rot_orig [9];
  double local_68;
  double rot_update [9];
  
  if ((this->opts).fixed_intrinsics == true) {
    out->focal_length = cam->focal_length;
    out->distortion[0] = cam->distortion[0];
    dVar4 = cam->distortion[1];
    lVar2 = 0;
  }
  else {
    out->focal_length = cam->focal_length + *update;
    out->distortion[0] = cam->distortion[0] + update[1];
    dVar4 = cam->distortion[1] + update[2];
    lVar2 = 3;
  }
  out->distortion[1] = dVar4;
  pdVar1 = update + lVar2;
  out->translation[0] = cam->translation[0] + *pdVar1;
  out->translation[1] = cam->translation[1] + pdVar1[1];
  out->translation[2] = cam->translation[2] + pdVar1[2];
  pdVar3 = cam->rotation;
  this_00 = (BundleAdjustment *)local_b8;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    *(double *)&this_00->opts = *pdVar3;
    pdVar3 = pdVar3 + 1;
    this_00 = (BundleAdjustment *)&(this_00->opts).fixed_intrinsics;
  }
  rodrigues_to_matrix(this_00,pdVar1 + 3,&local_68);
  math::matrix_multiply<double>(&local_68,3,3,(double *)local_b8,3,out->rotation);
  return;
}

Assistant:

void
BundleAdjustment::update_camera (Camera const& cam,
    double const* update, Camera* out)
{
    if (opts.fixed_intrinsics)
    {
        out->focal_length = cam.focal_length;
        out->distortion[0] = cam.distortion[0];
        out->distortion[1] = cam.distortion[1];
    }
    else
    {
        out->focal_length = cam.focal_length + update[0];
        out->distortion[0] = cam.distortion[0] + update[1];
        out->distortion[1] = cam.distortion[1] + update[2];
    }

    int const offset = this->opts.fixed_intrinsics ? 0 : 3;
    out->translation[0] = cam.translation[0] + update[0 + offset];
    out->translation[1] = cam.translation[1] + update[1 + offset];
    out->translation[2] = cam.translation[2] + update[2 + offset];

    double rot_orig[9];
    std::copy(cam.rotation, cam.rotation + 9, rot_orig);
    double rot_update[9];
    this->rodrigues_to_matrix(update + 3 + offset, rot_update);
    math::matrix_multiply(rot_update, 3, 3, rot_orig, 3, out->rotation);
}